

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall
tinygltf::AnimationChannel::AnimationChannel(AnimationChannel *this,AnimationChannel *param_1)

{
  int iVar1;
  AnimationChannel *param_1_local;
  AnimationChannel *this_local;
  
  iVar1 = param_1->target_node;
  this->sampler = param_1->sampler;
  this->target_node = iVar1;
  std::__cxx11::string::string((string *)&this->target_path,(string *)&param_1->target_path);
  Value::Value(&this->extras,&param_1->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  Value::Value(&this->target_extras,&param_1->target_extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->target_extensions,&param_1->target_extensions);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  std::__cxx11::string::string
            ((string *)&this->target_extras_json_string,
             (string *)&param_1->target_extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->target_extensions_json_string,
             (string *)&param_1->target_extensions_json_string);
  return;
}

Assistant:

AnimationChannel() = default;